

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

int fprint<char_const*,std::__cxx11::string>
              (FILE *out,char *fmt,char **args,
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  string str;
  
  stringformat<char_const*,std::__cxx11::string>(&str,fmt,args,args_1);
  sVar1 = fwrite(str._M_dataplus._M_p,str._M_string_length,1,(FILE *)out);
  std::__cxx11::string::~string((string *)&str);
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}